

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void g_canvas_newpdinstance(void)

{
  pd_maininstance.pd_gui = (_instancecanvas *)getbytes(0x48);
  (pd_maininstance.pd_gui)->i_newdirectory = &s_;
  (pd_maininstance.pd_gui)->i_newfilename = &s_;
  (pd_maininstance.pd_gui)->i_newargc = 0;
  (pd_maininstance.pd_gui)->i_newargv = (t_atom *)0x0;
  (pd_maininstance.pd_gui)->i_reloadingabstraction = (_glist *)0x0;
  (pd_maininstance.pd_gui)->i_dspstate = 0;
  (pd_maininstance.pd_gui)->i_dollarzero = 1000;
  g_editor_newpdinstance();
  g_template_newpdinstance();
  return;
}

Assistant:

void g_canvas_newpdinstance(void)
{
    THISGUI = getbytes(sizeof(*THISGUI));
    THISGUI->i_newfilename = THISGUI->i_newdirectory = &s_;
    THISGUI->i_newargc = 0;
    THISGUI->i_newargv = 0;
    THISGUI->i_reloadingabstraction = 0;
    THISGUI->i_dspstate = 0;
    THISGUI->i_dollarzero = 1000;
    g_editor_newpdinstance();
    g_template_newpdinstance();
}